

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,char *ptr,ParseContext *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  byte bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ulong uVar4;
  bool bVar5;
  MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
  *pMVar6;
  ValueMapEntryAccessorType *this_00;
  string *this_01;
  uint uVar7;
  char *pcVar8;
  undefined8 *puVar9;
  pair<const_char_*,_int> pVar10;
  char *local_50;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  local_48;
  
  local_50 = ptr;
  bVar5 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,&local_50,ctx->group_depth_);
  if (bVar5) {
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else if (*local_50 == '\n') {
    bVar1 = local_50[1];
    uVar7 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar10 = ReadSizeFallback(local_50 + 1,(uint)bVar1);
      uVar7 = pVar10.second;
      pcVar8 = pVar10.first;
      if (pcVar8 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      pcVar8 = local_50 + 2;
    }
    s = &this->key_;
    local_50 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar8,uVar7,s);
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
    bVar5 = WireFormatLite::VerifyUtf8String
                      ((this->key_)._M_dataplus._M_p,(int)(this->key_)._M_string_length,PARSE,
                       "CoreML.Specification.Metadata.UserDefinedEntry.key");
    if (!bVar5) {
      return (char *)0x0;
    }
    bVar5 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,&local_50,ctx->group_depth_);
    if (bVar5) {
      if (local_50 == (char *)0x0) {
        return (char *)0x0;
      }
LAB_00135fe4:
      pMVar6 = (MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                *)Arena::
                  CreateMaybeMessage<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse>
                            ((this->mf_->map_).elements_.alloc_.arena_);
      this->entry_ = pMVar6;
    }
    else {
      if (*local_50 != '\x12') goto LAB_00135fe4;
      sVar2 = (this->map_->elements_).num_elements_;
      Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::insert<std::__cxx11::string&>
                (&local_48,this->map_,s);
      this->value_ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(local_48.first.node_)->field_0x20;
      if (sVar2 == (this->map_->elements_).num_elements_) goto LAB_00135fe4;
      bVar1 = local_50[1];
      uVar7 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar10 = ReadSizeFallback(local_50 + 1,(uint)bVar1);
        uVar7 = pVar10.second;
        pcVar8 = pVar10.first;
        if (pcVar8 == (char *)0x0) {
          local_50 = (char *)0x0;
          goto LAB_00135fa5;
        }
      }
      else {
        pcVar8 = local_50 + 2;
      }
      local_50 = EpsCopyInputStream::ReadString
                           (&ctx->super_EpsCopyInputStream,pcVar8,uVar7,
                            (string *)&(local_48.first.node_)->field_0x20);
      if ((local_50 == (char *)0x0) ||
         (bVar5 = WireFormatLite::VerifyUtf8String
                            ((this->value_ptr_->_M_dataplus)._M_p,
                             (int)this->value_ptr_->_M_string_length,PARSE,
                             "CoreML.Specification.Metadata.UserDefinedEntry.value"), !bVar5)) {
LAB_00135fa5:
        Map<std::__cxx11::string,std::__cxx11::string>::erase<std::__cxx11::string>
                  ((Map<std::__cxx11::string,std::__cxx11::string> *)this->map_,s);
        return (char *)0x0;
      }
      bVar5 = EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,&local_50,ctx->group_depth_);
      if (bVar5) {
        return local_50;
      }
      if (local_50 == (char *)0x0) {
        return (char *)0x0;
      }
      pMVar6 = (MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                *)Arena::
                  CreateMaybeMessage<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse>
                            ((this->mf_->map_).elements_.alloc_.arena_);
      this->entry_ = pMVar6;
      pbVar3 = this->value_ptr_;
      this_00 = mutable_value(pMVar6);
      std::__cxx11::string::operator=((string *)this_00,(string *)pbVar3);
      Map<std::__cxx11::string,std::__cxx11::string>::erase<std::__cxx11::string>
                ((Map<std::__cxx11::string,std::__cxx11::string> *)this->map_,s);
      pMVar6 = this->entry_;
    }
    *(byte *)pMVar6->_has_bits_ = (byte)pMVar6->_has_bits_[0] | 1;
    uVar4 = (((MapEntryLite<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
               *)&pMVar6->super_MessageLite)->
            super_MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
            ).super_MessageLite._internal_metadata_.ptr_;
    puVar9 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      puVar9 = (undefined8 *)*puVar9;
    }
    this_01 = ArenaStringPtr::Mutable_abi_cxx11_(&pMVar6->key_,puVar9);
    std::__cxx11::string::operator=((string *)this_01,(string *)s);
    pMVar6 = this->entry_;
    goto LAB_00136022;
  }
  pMVar6 = (MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
            *)Arena::CreateMaybeMessage<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse>
                        ((this->mf_->map_).elements_.alloc_.arena_);
  this->entry_ = pMVar6;
LAB_00136022:
  local_50 = MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
             ::_InternalParse(pMVar6,local_50,ctx);
  if (local_50 == (char *)0x0) {
    return (char *)0x0;
  }
  UseKeyAndValueFromEntry(this);
  return local_50;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }